

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::cmComputeTargetDepends(cmComputeTargetDepends *this,cmGlobalGenerator *gg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmake *pcVar3;
  cmState *pcVar4;
  bool bVar5;
  string local_58;
  
  (this->Targets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Targets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Targets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x98);
  this->GlobalGenerator = gg;
  pcVar3 = gg->CMakeInstance;
  pcVar4 = (pcVar3->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"GLOBAL_DEPENDS_DEBUG_MODE","");
  bVar5 = cmState::GetGlobalPropertyAsBool(pcVar4,&local_58);
  this->DebugMode = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (pcVar3->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GLOBAL_DEPENDS_NO_CYCLES","")
  ;
  bVar5 = cmState::GetGlobalPropertyAsBool(pcVar4,&local_58);
  this->NoCycles = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmComputeTargetDepends::cmComputeTargetDepends(cmGlobalGenerator* gg)
{
  this->GlobalGenerator = gg;
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->DebugMode =
    cm->GetState()->GetGlobalPropertyAsBool("GLOBAL_DEPENDS_DEBUG_MODE");
  this->NoCycles =
    cm->GetState()->GetGlobalPropertyAsBool("GLOBAL_DEPENDS_NO_CYCLES");
}